

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_impl.hpp
# Opt level: O2

value * __thiscall lightconf::value::operator=(value *this,value *rhs)

{
  if (rhs != this) {
    this->number_value_ = rhs->number_value_;
    std::__cxx11::string::_M_assign((string *)&this->string_value_);
    this->bool_value_ = rhs->bool_value_;
    std::vector<lightconf::value,_std::allocator<lightconf::value>_>::operator=
              (&this->vector_value_,&rhs->vector_value_);
    group::operator=(&this->group_value_,&rhs->group_value_);
    this->type_ = rhs->type_;
  }
  return this;
}

Assistant:

inline value& value::operator=(const value& rhs) {
    if (&rhs != this) {
        number_value_ = rhs.number_value_;
        string_value_ = rhs.string_value_;
        bool_value_ = rhs.bool_value_;
        vector_value_ = rhs.vector_value_;
        group_value_ = rhs.group_value_;
        type_ = rhs.type_;
    }
    return *this;
}